

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

void __thiscall soplex::SPxFastRT<double>::setType(SPxFastRT<double> *this,Type type)

{
  double dVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar3;
  
  (this->super_SPxRatioTester<double>).m_type = type;
  peVar2 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->super_SPxRatioTester<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    dVar1 = peVar2->s_epsilon_multiplier;
    uVar3 = -(ulong)(dVar1 == 1.0);
    this->minStab = (double)(~uVar3 & (ulong)(dVar1 * 1e-05) | uVar3 & 0x3ee4f8b588e368f1);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    dVar1 = peVar2->s_epsilon_multiplier;
    uVar3 = -(ulong)(dVar1 == 1.0);
    this->minStab = (double)(~uVar3 & (ulong)(dVar1 * 1e-05) | uVar3 & 0x3ee4f8b588e368f1);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this->fastDelta = (this->super_SPxRatioTester<double>).delta;
  return;
}

Assistant:

void SPxFastRT<R>::setType(typename SPxSolverBase<R>::Type type)
{
   this->m_type = type;

   minStab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB);
   fastDelta = this->delta;
}